

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdash_reporter.c
# Opt level: O1

void cdash_show_fail(TestReporter *reporter,char *file,int line,char *message,
                    __va_list_tag *arguments)

{
  CDashMemo *memo;
  char *pcVar1;
  double dVar2;
  time_t t1;
  tm d1;
  
  memo = (CDashMemo *)reporter->memo;
  t1 = time((time_t *)0x0);
  gmtime_r(&t1,(tm *)&d1);
  memo->testfinished = t1;
  dVar2 = difftime(t1,memo->teststarted);
  pcVar1 = get_current_from_breadcrumb(reporter->breadcrumb);
  (*memo->printer)(memo->stream,
                   "    <Test Status=\"%s\">\n     <Name>%s</Name>\n     <Path>%s</Path>\n     <FullName>%s</FullName>\n     <FullCommandLine>at [%s] line [%d]</FullCommandLine>\n"
                   ,"failed",pcVar1,file,file,file,(ulong)(uint)line);
  (*memo->printer)(memo->stream,
                   "     <Results>\n      <NamedMeasurement type=\"numeric/double\" name=\"Execution Time\">\n       <Value>%f</Value>\n      </NamedMeasurement>\n      <NamedMeasurement type=\"text/string\" name=\"Completion Status\">\n       <Value>Completed</Value>\n      </NamedMeasurement>\n      <NamedMeasurement type=\"text/string\" name=\"Command Line\">\n       <Value>%s</Value>\n      </NamedMeasurement>\n"
                   ,(double)(float)(double)(~-(ulong)(dVar2 == 0.0) & (ulong)(dVar2 / 60.0)),pcVar1)
  ;
  print_measurement(memo,message,arguments);
  (*memo->printer)(memo->stream,"      </Results>\n    </Test>\n");
  return;
}

Assistant:

static void cdash_show_fail(TestReporter *reporter, const char *file, int line, const char *message, va_list arguments) {
    const char *name;
    float exectime;
    CDashMemo *memo;

    memo = (CDashMemo *)reporter->memo;

    memo->testfinished = cdash_current_time(NULL);

    exectime = (float)cdash_elapsed_time(memo->teststarted, memo->testfinished);

    name = get_current_from_breadcrumb((CgreenBreadcrumb *)reporter->breadcrumb);

    print_test_header(memo, "failed", name, file, line);
    print_results_header(memo, name, exectime);
    print_measurement(memo, message, arguments);
    print_tail(memo);
}